

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

ON_SubDVertex * __thiscall
ON_SubDRTree::FindVertexAtPoint(ON_SubDRTree *this,ON_3dPoint P,double distance_tolerance)

{
  ON_BoundingBox rbox;
  ON_3dVector rtol;
  ON_3dPoint local_c0;
  ON_BoundingBox local_a8;
  ON_3dVector local_70;
  ON_3dPoint local_58;
  double local_40;
  ON_SubDVertex *local_38;
  undefined8 uStack_30;
  
  local_58.z = P.z;
  local_58.x = P.x;
  local_58.y = P.y;
  local_38 = (ON_SubDVertex *)0x0;
  uStack_30 = 0;
  local_40 = ON_DBL_QNAN;
  ON_BoundingBox::ON_BoundingBox(&local_a8);
  ON_3dVector::ON_3dVector(&local_70,distance_tolerance,distance_tolerance,distance_tolerance);
  ON_3dPoint::operator-(&local_c0,&local_58,&local_70);
  local_a8.m_min.z = local_c0.z;
  local_a8.m_min.x = local_c0.x;
  local_a8.m_min.y = local_c0.y;
  ON_3dPoint::operator+(&local_c0,&local_58,&local_70);
  local_a8.m_max.z = local_c0.z;
  local_a8.m_max.x = local_c0.x;
  local_a8.m_max.y = local_c0.y;
  ON_RTree::Search((ON_RTree *)this,(double *)&local_a8,&local_a8.m_max.x,
                   ON_SubDRTreeVertexFinder::Callback,&local_58);
  return local_38;
}

Assistant:

const ON_SubDVertex* ON_SubDRTree::FindVertexAtPoint(
  const ON_3dPoint P,
  const double distance_tolerance
) const
{
  ON_SubDRTreeVertexFinder vf;
  vf = ON_SubDRTreeVertexFinder::Create(P);

  ON_BoundingBox rbox;
  const ON_3dVector rtol(distance_tolerance, distance_tolerance, distance_tolerance);

  rbox.m_min = vf.m_P - rtol;
  rbox.m_max = vf.m_P + rtol;
  // vtree.Search() can return true (found nearby) and false (found exact) because 
  // ON_SubDRTreeVertexFinder::Callback() cancels the search when a vertex at the exact location
  // is found.
  this->Search(&rbox.m_min.x, &rbox.m_max.x, ON_SubDRTreeVertexFinder::Callback, &vf);
  return vf.m_v;
}